

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_errno(lua_State *L)

{
  int iVar1;
  int32_t iVar2;
  int *piVar3;
  TValue *pTVar4;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  pTVar4 = L->top;
  if (L->base < pTVar4) {
    iVar2 = ffi_checkint(L,1);
    *piVar3 = iVar2;
    pTVar4 = L->top;
  }
  L->top = pTVar4 + 1;
  pTVar4->n = (double)iVar1;
  return 1;
}

Assistant:

LJLIB_CF(ffi_errno)	LJLIB_REC(.)
{
  int err = errno;
  if (L->top > L->base)
    errno = ffi_checkint(L, 1);
  setintV(L->top++, err);
  return 1;
}